

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FeatureTypes.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ImageFeatureType_EnumeratedImageSizes::Clear
          (ImageFeatureType_EnumeratedImageSizes *this)

{
  uint32_t cached_has_bits;
  ImageFeatureType_EnumeratedImageSizes *this_local;
  
  google::protobuf::RepeatedPtrField<CoreML::Specification::ImageFeatureType_ImageSize>::Clear
            (&this->sizes_);
  google::protobuf::internal::InternalMetadata::Clear<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

void ImageFeatureType_EnumeratedImageSizes::Clear() {
// @@protoc_insertion_point(message_clear_start:CoreML.Specification.ImageFeatureType.EnumeratedImageSizes)
  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  sizes_.Clear();
  _internal_metadata_.Clear<std::string>();
}